

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

void toggle_overlays(Fl_Widget *param_1,void *param_2)

{
  Fl_Type *pFVar1;
  int iVar2;
  Fl_Widget_Type *w;
  Fl_Type **ppFVar3;
  
  Main_Menu[0x28].text = "Hide O&verlays";
  if (overlays_invisible == 0) {
    Main_Menu[0x28].text = "Show O&verlays";
  }
  overlays_invisible = (int)(overlays_invisible == 0);
  ppFVar3 = &Fl_Type::first;
  while (pFVar1 = *ppFVar3, pFVar1 != (Fl_Type *)0x0) {
    iVar2 = (*pFVar1->_vptr_Fl_Type[0x21])(pFVar1);
    if (iVar2 != 0) {
      Fl_Overlay_Window::redraw_overlay((Fl_Overlay_Window *)pFVar1[1].prev);
    }
    ppFVar3 = &pFVar1->next;
  }
  return;
}

Assistant:

void toggle_overlays(Fl_Widget *,void *) {
  overlays_invisible = !overlays_invisible;

  if (overlays_invisible) Main_Menu[40].label("Show O&verlays");
  else Main_Menu[40].label("Hide O&verlays");

  for (Fl_Type *o=Fl_Type::first; o; o=o->next)
    if (o->is_window()) {
      Fl_Widget_Type* w = (Fl_Widget_Type*)o;
      ((Overlay_Window*)(w->o))->redraw_overlay();
    }
}